

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockAtomicCounterBufferIndexContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  NodeType NVar1;
  Node *this;
  ArrayElement *pAVar2;
  Variable *pVVar3;
  TestNode *node;
  TestContext *testCtx;
  ResourceTestCase *pRVar4;
  TestCaseGroup *blockGroup;
  SharedPtr elementvariable;
  SharedPtr variable;
  SharedPtr arrayArrayElement;
  undefined1 local_40 [8];
  SharedPtr arrayElement;
  bool isInterfaceBlock;
  ProgramResourceQueryTestTarget queryTarget;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  queryTarget = (ProgramResourceQueryTestTarget)targetGroup;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,PROGRAMINTERFACE_UNIFORM,8);
  this = de::
         SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
         ::operator->(parentStructure);
  NVar1 = ResourceDefinition::Node::getType(this);
  arrayElement.m_state._7_1_ = NVar1 == TYPE_INTERFACE_BLOCK;
  if ((bool)arrayElement.m_state._7_1_) {
    generateVariableCases
              (context,parentStructure,(TestCaseGroup *)queryTarget,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,1,false);
  }
  else {
    generateVariableCases
              (context,parentStructure,(TestCaseGroup *)queryTarget,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,3,true);
    generateOpaqueTypeCases
              (context,parentStructure,(TestCaseGroup *)queryTarget,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,3,true);
    pAVar2 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar2,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_40,(Node *)pAVar2);
    pAVar2 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar2,(SharedPtr *)local_40,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable.m_state,(Node *)pAVar2);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar3,(SharedPtr *)local_40,TYPE_UINT_ATOMIC_COUNTER);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&elementvariable.m_state,(Node *)pVVar3);
    pVVar3 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable
              (pVVar3,(SharedPtr *)&variable.m_state,TYPE_UINT_ATOMIC_COUNTER);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup,(Node *)pVVar3);
    node = (TestNode *)operator_new(0x70);
    testCtx = gles31::Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,testCtx,"array","Arrays");
    tcu::TestNode::addChild((TestNode *)queryTarget,node);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,(SharedPtr *)&elementvariable.m_state,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,"var_array");
    tcu::TestNode::addChild(node,(TestNode *)pRVar4);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar4,context,(SharedPtr *)&blockGroup,
               (ProgramResourceQueryTestTarget *)&stack0xffffffffffffffd8,"var_array_array");
    tcu::TestNode::addChild(node,(TestNode *)pRVar4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&blockGroup);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&elementvariable.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_40);
  }
  return;
}

Assistant:

static void generateUniformBlockAtomicCounterBufferIndexContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_ATOMIC_COUNTER_BUFFER_INDEX);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);

	if (!isInterfaceBlock)
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 3);
		generateOpaqueTypeCases(context, parentStructure, targetGroup, queryTarget, 3);

		// .array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayArrayElement	(new ResourceDefinition::ArrayElement(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variable			(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));
			const ResourceDefinition::Node::SharedPtr	elementvariable		(new ResourceDefinition::Variable(arrayArrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));
			tcu::TestCaseGroup* const					blockGroup			= new tcu::TestCaseGroup(context.getTestContext(), "array", "Arrays");

			targetGroup->addChild(blockGroup);

			blockGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "var_array"));
			blockGroup->addChild(new ResourceTestCase(context, elementvariable, queryTarget, "var_array_array"));
		}
	}
	else
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1, false);
}